

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O3

void * utf8str(void *haystack,void *needle)

{
  char cVar1;
  char cVar2;
  long lVar3;
  char *h;
  
  if (*needle == '\0') {
    return haystack;
  }
  cVar2 = *haystack;
  do {
    while( true ) {
      if (cVar2 == '\0') {
        return (void *)0x0;
      }
      if (cVar2 == *needle) break;
LAB_00111196:
      cVar2 = *(char *)((long)haystack + 1);
      haystack = (void *)((long)haystack + 1);
    }
    lVar3 = 0;
    do {
      cVar2 = *(char *)((long)haystack + lVar3 + 1);
      cVar1 = *(char *)((long)needle + lVar3 + 1);
      lVar3 = lVar3 + 1;
    } while (cVar2 == cVar1);
    if (cVar1 == '\0') {
      return haystack;
    }
    haystack = (void *)((long)haystack + lVar3);
    if (cVar2 != '\0') goto LAB_00111196;
    cVar2 = '\0';
  } while( true );
}

Assistant:

void *utf8str(const void *haystack, const void *needle) {
  const char *h = (const char *)haystack;

  // if needle has no utf8 codepoints before the null terminating
  // byte then return haystack
  if ('\0' == *((const char *)needle)) {
    return (void *)haystack;
  }

  while ('\0' != *h) {
    const char *maybeMatch = h;
    const char *n = (const char *)needle;

    while (*h == *n) {
      n++;
      h++;
    }

    if ('\0' == *n) {
      // we found the whole utf8 string for needle in haystack at
      // maybeMatch, so return it
      return (void *)maybeMatch;
    } else {
      // h could be in the middle of an unmatching utf8 codepoint,
      // so we need to march it on to the next character beginning,
      if ('\0' != *h) {
        do {
          h++;
        } while (0x80 == (0xc0 & *h));
      }
    }
  }

  // no match
  return 0;
}